

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_append_entries(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  element_type *peVar3;
  ulong uVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  _func_int **pp_Var8;
  long *plVar9;
  int iVar10;
  undefined8 uVar11;
  undefined8 *puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  undefined4 extraout_var;
  size_t sVar16;
  undefined4 extraout_var_00;
  runtime_error *prVar17;
  long lVar18;
  long in_RDX;
  undefined **ppuVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  ptr<resp_msg> pVar26;
  ptr<log_entry> old_entry;
  ptr<log_entry> entry;
  long *local_160 [2];
  long local_150 [2];
  long local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  raft_server *local_130;
  raft_server *local_128;
  long local_120;
  long local_118;
  long local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  char local_100 [104];
  char *local_98;
  char *local_38;
  
  local_128 = (raft_server *)req;
  if (*(element_type **)(in_RDX + 8) ==
      ((req[3].log_entries_.
        super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
    iVar10 = *(int *)&req[3].log_entries_.
                      super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    if (iVar10 == 2) {
      become_follower((raft_server *)req);
    }
    else {
      if (iVar10 == 3) {
        plVar9 = (long *)req[4].last_log_term_;
        local_38 = 
        "Receive AppendEntriesRequest from another leader(%d) with same term, there must be a bug, server exits"
        ;
        snprintf(local_100,200,
                 "Receive AppendEntriesRequest from another leader(%d) with same term, there must be a bug, server exits"
                 ,(ulong)*(uint *)(in_RDX + 0x14));
        local_160[0] = local_150;
        sVar16 = strlen(local_100);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_160,local_100,local_100 + sVar16);
        (**(code **)(*plVar9 + 0x10))(plVar9,local_160);
        std::__cxx11::string::~string((string *)local_160);
        peVar3 = (((((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                      *)&local_128->ctx_)->
                   super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (**(code **)(peVar3->term_ + 0x40))(peVar3,0xffffffff);
        exit(-1);
      }
      restart_election_timer((raft_server *)req);
    }
  }
  peVar3 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  uVar11 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
  puVar12 = (undefined8 *)operator_new(0x40);
  puVar12[1] = 0x100000001;
  *puVar12 = &PTR___Sp_counted_ptr_inplace_00178730;
  uVar2 = *(undefined4 *)((long)&(req->super_msg_base).term_ + 4);
  puVar12[3] = peVar3;
  *(undefined4 *)(puVar12 + 4) = 4;
  *(undefined4 *)((long)puVar12 + 0x24) = uVar2;
  *(undefined4 *)(puVar12 + 5) = uVar1;
  ppuVar19 = &PTR__msg_base_00178780;
  puVar12[2] = &PTR__msg_base_00178780;
  puVar12[6] = uVar11;
  *(undefined1 *)(puVar12 + 7) = 0;
  *(undefined8 **)&this->leader_ = puVar12;
  this->_vptr_raft_server = (_func_int **)(puVar12 + 2);
  uVar22 = *(ulong *)(in_RDX + 0x28);
  if (uVar22 == 0) {
    bVar24 = false;
  }
  else {
    auVar25 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
    ppuVar19 = auVar25._8_8_;
    if (auVar25._0_8_ <= uVar22) goto LAB_0014c907;
    uVar4 = *(ulong *)(in_RDX + 0x20);
    uVar13 = term_for_log((raft_server *)req,*(ulong *)(in_RDX + 0x28));
    bVar24 = uVar4 != uVar13;
    ppuVar19 = (undefined **)extraout_RDX;
  }
  if ((bVar24) ||
     (*(element_type **)(in_RDX + 8) <
      ((req[3].log_entries_.
        super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr))
  goto LAB_0014c907;
  local_130 = this;
  if (*(long *)(in_RDX + 0x40) != *(long *)(in_RDX + 0x38)) {
    lVar23 = *(long *)(in_RDX + 0x28) + 1;
    lVar21 = 8;
    for (uVar22 = 0;
        (uVar14 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))(), local_120 = in_RDX,
        lVar18 = lVar23, uVar22 + lVar23 < uVar14 &&
        (uVar22 < (ulong)(*(long *)(in_RDX + 0x40) - *(long *)(in_RDX + 0x38) >> 4)));
        uVar22 = uVar22 + 1) {
      lVar15 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x48))();
      if ((ulong)(*(long *)(in_RDX + 0x40) - *(long *)(in_RDX + 0x38) >> 4) <= uVar22) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar22);
        goto LAB_0014c9a2;
      }
      if (lVar15 != **(long **)(*(long *)(in_RDX + 0x38) + -8 + lVar21)) break;
      lVar21 = lVar21 + 0x10;
    }
    do {
      local_118 = lVar18;
      iVar10 = (*((((raft_server *)req)->log_store_).
                  super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_log_store[2])();
      uVar14 = uVar22 + lVar23;
      lVar18 = *(long *)(in_RDX + 0x38);
      uVar20 = *(long *)(in_RDX + 0x40) - lVar18 >> 4;
      if ((CONCAT44(extraout_var,iVar10) <= uVar14) || (uVar20 <= uVar22)) goto LAB_0014c784;
      peVar5 = (((raft_server *)req)->log_store_).
               super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar5->_vptr_log_store[8])(&local_140,peVar5,uVar14);
      if (*(int *)(local_140 + 8) == 2) {
        peVar7 = (((raft_server *)req)->l_).
                 super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_98 = "revert from a prev config change to config at %llu";
        snprintf(local_100,100,"revert from a prev config change to config at %llu",
                 ((((raft_server *)req)->config_).
                  super___shared_ptr<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->log_idx_);
        local_160[0] = local_150;
        sVar16 = strlen(local_100);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_160,local_100,local_100 + sVar16);
        (*peVar7->_vptr_logger[3])(peVar7,(string *)local_160);
        lVar23 = local_118;
        in_RDX = local_120;
        req = (req_msg *)local_128;
        if (local_160[0] != local_150) {
          operator_delete(local_160[0],local_150[0] + 1);
        }
        ((raft_server *)req)->config_changing_ = false;
      }
      else if (*(int *)(local_140 + 8) == 1) {
        if (*(long *)(local_140 + 0x18) == 0) goto LAB_0014c92d;
        peVar6 = (((raft_server *)req)->state_machine_).
                 super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar6->_vptr_state_machine[4])
                  (peVar6,uVar14,*(long *)(local_140 + 0x18),local_140 + 0x20);
      }
      lVar18 = *(long *)(in_RDX + 0x38);
      if ((ulong)(*(long *)(in_RDX + 0x40) - lVar18 >> 4) <= uVar22) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar22);
LAB_0014c92d:
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar17,"get_buf cannot be called for a log_entry with nil buffer");
        __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_110 = *(long *)(lVar18 + -8 + lVar21);
      local_108 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar18 + lVar21);
      if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_108->_M_use_count = local_108->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_108->_M_use_count = local_108->_M_use_count + 1;
        }
      }
      peVar5 = (((raft_server *)req)->log_store_).
               super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar5->_vptr_log_store[6])(peVar5,uVar14,&local_110);
      if (*(int *)(local_110 + 8) == 2) {
        peVar7 = (((raft_server *)req)->l_).
                 super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_98 = "receive a config change from leader at %llu";
        snprintf(local_100,100,"receive a config change from leader at %llu",uVar14);
        local_160[0] = local_150;
        sVar16 = strlen(local_100);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_160,local_100,local_100 + sVar16);
        (*peVar7->_vptr_logger[3])(peVar7,(string *)local_160);
        lVar23 = local_118;
        in_RDX = local_120;
        req = (req_msg *)local_128;
        if (local_160[0] != local_150) {
          operator_delete(local_160[0],local_150[0] + 1);
        }
        ((raft_server *)req)->config_changing_ = true;
      }
      else if (*(int *)(local_110 + 8) == 1) {
        if (*(long *)(local_110 + 0x18) == 0) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar17,"get_buf cannot be called for a log_entry with nil buffer");
          __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        peVar6 = (((raft_server *)req)->state_machine_).
                 super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar6->_vptr_state_machine[3])
                  (peVar6,uVar14,*(long *)(local_110 + 0x18),local_110 + 0x20);
      }
      if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
      }
      if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
      }
      lVar21 = lVar21 + 0x10;
      uVar22 = uVar22 + 1;
      lVar18 = local_118;
    } while( true );
  }
  goto LAB_0014c8cc;
LAB_0014c784:
  if (uVar22 < uVar20) {
    do {
      local_140 = *(long *)(lVar18 + -8 + lVar21);
      local_138 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar18 + lVar21);
      if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_138->_M_use_count = local_138->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_138->_M_use_count = local_138->_M_use_count + 1;
        }
      }
      peVar5 = (((raft_server *)req)->log_store_).
               super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar10 = (*peVar5->_vptr_log_store[5])(peVar5,&local_140);
      if (*(int *)(local_140 + 8) == 1) {
        if (*(long *)(local_140 + 0x18) == 0) {
LAB_0014c9a2:
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar17,"get_buf cannot be called for a log_entry with nil buffer");
          __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        peVar6 = (((raft_server *)req)->state_machine_).
                 super___shared_ptr<cornerstone::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar6->_vptr_state_machine[3])
                  (peVar6,CONCAT44(extraout_var_00,iVar10),*(long *)(local_140 + 0x18),
                   local_140 + 0x20);
      }
      else if (*(int *)(local_140 + 8) == 2) {
        peVar7 = (((raft_server *)req)->l_).
                 super___shared_ptr<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_98 = "receive a config change from leader at %llu";
        snprintf(local_100,100,"receive a config change from leader at %llu",
                 CONCAT44(extraout_var_00,iVar10));
        local_160[0] = local_150;
        sVar16 = strlen(local_100);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_160,local_100,local_100 + sVar16);
        (*peVar7->_vptr_logger[3])(peVar7,(string *)local_160);
        if (local_160[0] != local_150) {
          operator_delete(local_160[0],local_150[0] + 1);
        }
        ((raft_server *)req)->config_changing_ = true;
      }
      if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
      }
      uVar22 = uVar22 + 1;
      lVar18 = *(long *)(in_RDX + 0x38);
      lVar21 = lVar21 + 0x10;
    } while (uVar22 < (ulong)(*(long *)(in_RDX + 0x40) - lVar18 >> 4));
  }
LAB_0014c8cc:
  this = local_130;
  ((raft_server *)req)->leader_ = *(int32 *)(in_RDX + 0x14);
  commit((raft_server *)req,*(ulong *)(in_RDX + 0x30));
  pp_Var8 = this->_vptr_raft_server;
  ppuVar19 = (undefined **)(*(long *)(in_RDX + 0x40) - *(long *)(in_RDX + 0x38) >> 4);
  pp_Var8[4] = (_func_int *)
               ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar19)->
                       _vptr__Sp_counted_base + *(long *)(in_RDX + 0x28) + 1);
  *(undefined1 *)(pp_Var8 + 5) = 1;
LAB_0014c907:
  pVar26.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar19;
  pVar26.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar26.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_append_entries(req_msg& req)
{
    if (req.get_term() == state_->get_term())
    {
        if (role_ == srv_role::candidate)
        {
            become_follower();
        }
        else if (role_ == srv_role::leader)
        {
            l_->debug(lstrfmt("Receive AppendEntriesRequest from another leader(%d) with same term, there must be a "
                              "bug, server exits")
                          .fmt(req.get_src()));
            ctx_->state_mgr_->system_exit(-1);
            ::exit(-1);
        }
        else
        {
            restart_election_timer();
        }
    }

    // After a snapshot the req.get_last_log_idx() may less than log_store_->next_slot() but equals to
    // log_store_->next_slot() -1 In this case, log is Okay if req.get_last_log_idx() == lastSnapshot.get_last_log_idx()
    // && req.get_last_log_term() == lastSnapshot.get_last_log_term() In not accepted case, we will return
    // log_store_->next_slot() for the leader to quick jump to the index that might aligned
    ptr<resp_msg> resp(cs_new<resp_msg>(
        state_->get_term(), msg_type::append_entries_response, id_, req.get_src(), log_store_->next_slot()));
    bool log_okay = req.get_last_log_idx() == 0 || (req.get_last_log_idx() < log_store_->next_slot() &&
                                                    req.get_last_log_term() == term_for_log(req.get_last_log_idx()));
    if (req.get_term() < state_->get_term() || !log_okay)
    {
        return resp;
    }

    // follower & log is okay
    if (req.log_entries().size() > 0)
    {
        // write logs to store, start from overlapped logs
        ulong idx = req.get_last_log_idx() + 1;
        size_t log_idx = 0;
        while (idx < log_store_->next_slot() && log_idx < req.log_entries().size())
        {
            if (log_store_->term_at(idx) == req.log_entries().at(log_idx)->get_term())
            {
                idx++;
                log_idx++;
            }
            else
            {
                break;
            }
        }

        // dealing with overwrites
        while (idx < log_store_->next_slot() && log_idx < req.log_entries().size())
        {
            ptr<log_entry> old_entry(log_store_->entry_at(idx));
            if (old_entry->get_val_type() == log_val_type::app_log)
            {
                state_machine_->rollback(idx, old_entry->get_buf(), old_entry->get_cookie());
            }
            else if (old_entry->get_val_type() == log_val_type::conf)
            {
                l_->info(sstrfmt("revert from a prev config change to config at %llu").fmt(config_->get_log_idx()));
                config_changing_ = false;
            }

            ptr<log_entry> entry = req.log_entries().at(log_idx);
            log_store_->write_at(idx, entry);
            if (entry->get_val_type() == log_val_type::app_log)
            {
                state_machine_->pre_commit(idx, entry->get_buf(), entry->get_cookie());
            }
            else if (entry->get_val_type() == log_val_type::conf)
            {
                l_->info(sstrfmt("receive a config change from leader at %llu").fmt(idx));
                config_changing_ = true;
            }

            idx += 1;
            log_idx += 1;
        }

        // append new log entries
        while (log_idx < req.log_entries().size())
        {
            ptr<log_entry> entry = req.log_entries().at(log_idx++);
            ulong idx_for_entry = log_store_->append(entry);
            if (entry->get_val_type() == log_val_type::conf)
            {
                l_->info(sstrfmt("receive a config change from leader at %llu").fmt(idx_for_entry));
                config_changing_ = true;
            }
            else if (entry->get_val_type() == log_val_type::app_log)
            {
                state_machine_->pre_commit(idx_for_entry, entry->get_buf(), entry->get_cookie());
            }
        }
    }

    leader_ = req.get_src();
    commit(req.get_commit_idx());
    resp->accept(req.get_last_log_idx() + req.log_entries().size() + 1);
    return resp;
}